

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O2

void ecp_clear_precomputed(mbedtls_ecp_group *grp)

{
  size_t i;
  ulong uVar1;
  long lVar2;
  
  if (grp->T != (mbedtls_ecp_point *)0x0) {
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < grp->T_size; uVar1 = uVar1 + 1) {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(grp->T->X).s + lVar2));
      lVar2 = lVar2 + 0x48;
    }
    free(grp->T);
  }
  grp->T = (mbedtls_ecp_point *)0x0;
  grp->T_size = 0;
  return;
}

Assistant:

void ecp_clear_precomputed( mbedtls_ecp_group *grp )
{
    if( grp->T != NULL )
    {
        size_t i;
        for( i = 0; i < grp->T_size; i++ )
            mbedtls_ecp_point_free( &grp->T[i] );
        mbedtls_free( grp->T );
    }
    grp->T = NULL;
    grp->T_size = 0;
}